

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

void duckdb::QuantileListOperation<duckdb::interval_t,true>::
     Finalize<duckdb::list_entry_t,duckdb::QuantileState<duckdb::interval_t,duckdb::QuantileStandardType>>
               (QuantileState<duckdb::interval_t,_duckdb::QuantileStandardType> *state,
               list_entry_t *target,AggregateFinalizeData *finalize_data)

{
  size_type *psVar1;
  size_type sVar2;
  FunctionData *pFVar3;
  Vector *pVVar4;
  uint64_t uVar5;
  reference q_00;
  idx_t n;
  unsigned_long *q;
  size_type *psVar6;
  long lVar7;
  idx_t iVar8;
  interval_t iVar9;
  QuantileDirect<duckdb::interval_t> local_89;
  list_entry_t *local_88;
  FunctionData *local_80;
  AggregateFinalizeData *local_78;
  pointer local_70;
  FunctionData *local_68;
  Vector *local_60;
  Interpolator<true> local_58;
  
  if ((state->v).super_vector<duckdb::interval_t,_std::allocator<duckdb::interval_t>_>.
      super__Vector_base<duckdb::interval_t,_std::allocator<duckdb::interval_t>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (state->v).super_vector<duckdb::interval_t,_std::allocator<duckdb::interval_t>_>.
      super__Vector_base<duckdb::interval_t,_std::allocator<duckdb::interval_t>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_88 = target;
    pFVar3 = optional_ptr<duckdb::FunctionData,_true>::operator->(&finalize_data->input->bind_data);
    pVVar4 = (Vector *)duckdb::ListVector::GetEntry(finalize_data->result);
    uVar5 = duckdb::ListVector::GetListSize(finalize_data->result);
    local_68 = pFVar3 + 8;
    local_78 = finalize_data;
    duckdb::ListVector::Reserve
              (finalize_data->result,
               (*(long *)(pFVar3 + 0x10) - *(long *)(pFVar3 + 8)) / 0x68 + uVar5);
    local_70 = (state->v).super_vector<duckdb::interval_t,_std::allocator<duckdb::interval_t>_>.
               super__Vector_base<duckdb::interval_t,_std::allocator<duckdb::interval_t>_>._M_impl.
               super__Vector_impl_data._M_start;
    lVar7 = uVar5 * 0x10 + *(long *)(pVVar4 + 0x20);
    local_88->offset = uVar5;
    psVar1 = *(size_type **)(pFVar3 + 0x28);
    iVar8 = 0;
    local_80 = pFVar3;
    local_60 = pVVar4;
    for (psVar6 = *(size_type **)(pFVar3 + 0x20); psVar6 != psVar1; psVar6 = psVar6 + 1) {
      q_00 = vector<duckdb::QuantileValue,_true>::get<true>
                       ((vector<duckdb::QuantileValue,_true> *)local_68,*psVar6);
      n = (long)(state->v).super_vector<duckdb::interval_t,_std::allocator<duckdb::interval_t>_>.
                super__Vector_base<duckdb::interval_t,_std::allocator<duckdb::interval_t>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(state->v).super_vector<duckdb::interval_t,_std::allocator<duckdb::interval_t>_>.
                super__Vector_base<duckdb::interval_t,_std::allocator<duckdb::interval_t>_>._M_impl.
                super__Vector_impl_data._M_start >> 4;
      local_58.desc = *(bool *)(local_80 + 0x38);
      local_58.FRN = Interpolator<true>::Index(q_00,n);
      local_58.CRN = local_58.FRN;
      local_58.begin = iVar8;
      local_58.end = n;
      iVar9 = Interpolator<true>::
              Operation<duckdb::interval_t,duckdb::interval_t,duckdb::QuantileDirect<duckdb::interval_t>>
                        (&local_58,local_70,local_60,&local_89);
      sVar2 = *psVar6;
      *(long *)(lVar7 + sVar2 * 0x10) = iVar9._0_8_;
      *(int64_t *)(lVar7 + 8 + sVar2 * 0x10) = iVar9.micros;
      iVar8 = local_58.FRN;
    }
    uVar5 = (*(long *)(local_80 + 0x10) - *(long *)(local_80 + 8)) / 0x68;
    local_88->length = uVar5;
    duckdb::ListVector::SetListSize(local_78->result,uVar5 + local_88->offset);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v.data();
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		idx_t lower = 0;
		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			Interpolator<DISCRETE> interp(quantile, state.v.size(), bind_data.desc);
			interp.begin = lower;
			rdata[ridx + q] = interp.template Operation<typename STATE::InputType, CHILD_TYPE>(v_t, result);
			lower = interp.FRN;
		}
		entry.length = bind_data.quantiles.size();

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}